

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void JS_AddIntrinsicRegExp(JSContext *ctx)

{
  JSValue *pJVar1;
  JSValue JVar2;
  JSValue func_obj;
  
  ctx->compile_regexp = js_compile_regexp;
  pJVar1 = ctx->class_proto;
  JVar2 = JS_NewObjectProtoClass(ctx,pJVar1[1],1);
  pJVar1[0x12] = JVar2;
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[0x12],js_regexp_proto_funcs,0x11);
  JVar2 = ctx->class_proto[0x12];
  func_obj = JS_NewCFunction3(ctx,js_regexp_constructor,"RegExp",2,JS_CFUNC_constructor_or_func,0,
                              ctx->function_proto);
  JS_NewGlobalCConstructor2(ctx,func_obj,"RegExp",JVar2);
  if (0xfffffff4 < (uint)func_obj.tag) {
    *(int *)func_obj.u.ptr = *func_obj.u.ptr + 1;
  }
  ctx->regexp_ctor = func_obj;
  JS_SetPropertyFunctionList(ctx,func_obj,js_regexp_funcs,1);
  pJVar1 = ctx->class_proto;
  JVar2 = JS_NewObjectProtoClass(ctx,ctx->iterator_proto,1);
  pJVar1[0x27] = JVar2;
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[0x27],js_regexp_string_iterator_proto_funcs,2);
  return;
}

Assistant:

void JS_AddIntrinsicRegExp(JSContext *ctx)
{
    JSValueConst obj;

    JS_AddIntrinsicRegExpCompiler(ctx);

    ctx->class_proto[JS_CLASS_REGEXP] = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_REGEXP], js_regexp_proto_funcs,
                               countof(js_regexp_proto_funcs));
    obj = JS_NewGlobalCConstructor(ctx, "RegExp", js_regexp_constructor, 2,
                                   ctx->class_proto[JS_CLASS_REGEXP]);
    ctx->regexp_ctor = JS_DupValue(ctx, obj);
    JS_SetPropertyFunctionList(ctx, obj, js_regexp_funcs, countof(js_regexp_funcs));

    ctx->class_proto[JS_CLASS_REGEXP_STRING_ITERATOR] =
        JS_NewObjectProto(ctx, ctx->iterator_proto);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_REGEXP_STRING_ITERATOR],
                               js_regexp_string_iterator_proto_funcs,
                               countof(js_regexp_string_iterator_proto_funcs));
}